

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

BinaryExpr<const_om::net::ip4_addr_&,_const_om::net::ip4_addr_&> * __thiscall
Catch::ExprLhs<om::net::ip4_addr_const&>::operator==
          (BinaryExpr<const_om::net::ip4_addr_&,_const_om::net::ip4_addr_&> *__return_storage_ptr__,
          ExprLhs<om::net::ip4_addr_const&> *this,ip4_addr *rhs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ip4_addr *piVar3;
  StringRef local_40;
  
  piVar3 = *(ip4_addr **)this;
  uVar1 = piVar3->_addr;
  uVar2 = rhs->_addr;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar1 == uVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001a49c8;
  __return_storage_ptr__->m_lhs = piVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }